

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O2

CTextureHandle __thiscall CMapImages::GetEasterTexture(CMapImages *this)

{
  IGraphics *pIVar1;
  IConsole *pIVar2;
  int iVar3;
  
  if (this->m_EasterIsLoaded == false) {
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    iVar3 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x12])
                      (pIVar1,"mapres/easter.png",0xffffffff,0xffffffffffffffff,4);
    (this->m_EasterTexture).m_Id = iVar3;
    if (iVar3 < 0) {
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pConsole;
      (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])
                (pIVar2,1,"mapimages","Failed to load easter.png",0);
    }
    this->m_EasterIsLoaded = true;
  }
  return (CTextureHandle)(this->m_EasterTexture).m_Id;
}

Assistant:

IGraphics::CTextureHandle CMapImages::GetEasterTexture()
{
	if(!m_EasterIsLoaded)
	{
		m_EasterTexture = Graphics()->LoadTexture("mapres/easter.png", IStorage::TYPE_ALL, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_ARRAY_256);
		if(!m_EasterTexture.IsValid())
			Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "mapimages", "Failed to load easter.png");
		m_EasterIsLoaded = true;
	}
	return m_EasterTexture;
}